

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rbuVfsShmMap(sqlite3_file *pFile,int iRegion,int szRegion,int isWrite,void **pp)

{
  int iVar1;
  sqlite3_io_methods *psVar2;
  long lVar3;
  void *pvVar4;
  undefined4 in_register_00000034;
  long lVar5;
  
  if ((pFile[3].pMethods == (sqlite3_io_methods *)0x0) || (1 < (pFile[3].pMethods)->iVersion - 1U))
  {
    iVar1 = (**(code **)(*(long *)pFile[1].pMethods + 0x68))
                      (pFile[1].pMethods,CONCAT44(in_register_00000034,iRegion),szRegion,isWrite,pp)
    ;
    return iVar1;
  }
  lVar5 = (long)iRegion;
  if (*(int *)((long)&pFile[6].pMethods + 4) < iRegion) {
    psVar2 = pFile[7].pMethods;
LAB_001b866d:
    pvVar4 = *(void **)(&psVar2->iVersion + lVar5 * 2);
    if (pvVar4 == (void *)0x0) {
      pvVar4 = sqlite3_malloc64((long)szRegion);
      if (pvVar4 == (void *)0x0) goto LAB_001b86ad;
      memset(pvVar4,0,(long)szRegion);
      *(void **)(&(pFile[7].pMethods)->iVersion + lVar5 * 2) = pvVar4;
      pvVar4 = *(void **)(&(pFile[7].pMethods)->iVersion + lVar5 * 2);
    }
    *pp = pvVar4;
    iVar1 = 0;
  }
  else {
    iVar1 = (int)(lVar5 + 1);
    psVar2 = (sqlite3_io_methods *)sqlite3_realloc64(pFile[7].pMethods,(long)iVar1 << 3);
    if (psVar2 != (sqlite3_io_methods *)0x0) {
      lVar3 = (long)*(int *)((long)&pFile[6].pMethods + 4);
      memset(&psVar2->iVersion + lVar3 * 2,0,((lVar5 + 1) - lVar3) * 8);
      pFile[7].pMethods = psVar2;
      *(int *)((long)&pFile[6].pMethods + 4) = iVar1;
      goto LAB_001b866d;
    }
LAB_001b86ad:
    *pp = (void *)0x0;
    iVar1 = 7;
  }
  return iVar1;
}

Assistant:

static int rbuVfsShmMap(
  sqlite3_file *pFile, 
  int iRegion, 
  int szRegion, 
  int isWrite, 
  void volatile **pp
){
  rbu_file *p = (rbu_file*)pFile;
  int rc = SQLITE_OK;
  int eStage = (p->pRbu ? p->pRbu->eStage : 0);

  /* If not in RBU_STAGE_OAL, allow this call to pass through. Or, if this
  ** rbu is in the RBU_STAGE_OAL state, use heap memory for *-shm space 
  ** instead of a file on disk.  */
  assert( p->openFlags & (SQLITE_OPEN_MAIN_DB|SQLITE_OPEN_TEMP_DB) );
  if( eStage==RBU_STAGE_OAL || eStage==RBU_STAGE_MOVE ){
    if( iRegion<=p->nShm ){
      sqlite3_int64 nByte = (iRegion+1) * sizeof(char*);
      char **apNew = (char**)sqlite3_realloc64(p->apShm, nByte);
      if( apNew==0 ){
        rc = SQLITE_NOMEM;
      }else{
        memset(&apNew[p->nShm], 0, sizeof(char*) * (1 + iRegion - p->nShm));
        p->apShm = apNew;
        p->nShm = iRegion+1;
      }
    }

    if( rc==SQLITE_OK && p->apShm[iRegion]==0 ){
      char *pNew = (char*)sqlite3_malloc64(szRegion);
      if( pNew==0 ){
        rc = SQLITE_NOMEM;
      }else{
        memset(pNew, 0, szRegion);
        p->apShm[iRegion] = pNew;
      }
    }

    if( rc==SQLITE_OK ){
      *pp = p->apShm[iRegion];
    }else{
      *pp = 0;
    }
  }else{
    assert( p->apShm==0 );
    rc = p->pReal->pMethods->xShmMap(p->pReal, iRegion, szRegion, isWrite, pp);
  }

  return rc;
}